

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

int __thiscall
asl::Array<wchar_t>::clone
          (Array<wchar_t> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Array(this,*(wchar_t **)__fn,(*(wchar_t **)__fn)[-4]);
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}